

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

uint64_t __thiscall
capnp::compiler::NodeTranslator::
compileParamList<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__2>
          (NodeTranslator *this,StringPtr methodName,uint16_t ordinal,bool isResults,
          Reader paramList,Reader implicitParams,Type *initBrand)

{
  ErrorReporter *pEVar1;
  Reader params;
  Reader source;
  ImplicitParams implicitMethodParams;
  Reader name;
  Builder builder_00;
  Builder sourceInfo;
  undefined1 auVar2 [56];
  Reader RVar3;
  bool bVar4;
  Which WVar5;
  uint uVar6;
  uint64_t uVar7;
  size_t sVar8;
  size_t sVar9;
  Orphan<capnp::schema::Node> *pOVar10;
  Orphan<capnp::schema::Node::SourceInfo> *pOVar11;
  BrandScope *pBVar12;
  unsigned_long *puVar13;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *other;
  BrandedDecl *pBVar14;
  NullableValue<capnp::compiler::Declaration::Which> *other_00;
  Which *pWVar15;
  Type *initBrand_00;
  NodeTranslator *params_2;
  Range<unsigned_long> RVar16;
  ArrayPtr<const_char> value;
  undefined8 uVar17;
  bool local_842;
  ArrayPtr<const_char> local_7e0;
  Reader local_7d0;
  String local_7a0;
  String local_788;
  ArrayPtr<const_char> local_770;
  Reader local_760;
  int local_72c;
  undefined1 local_728 [4];
  NullableValue<capnp::compiler::Declaration::Which> local_724;
  undefined1 auStack_720 [4];
  NullableValue<capnp::compiler::Declaration::Which> kind;
  undefined1 local_6e8 [48];
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_6b8;
  undefined1 local_608 [8];
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> target;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> local_528;
  undefined1 local_510 [24];
  Disposer *local_4f8;
  Builder local_4f0;
  BrandedDecl local_4c8;
  undefined1 local_420 [8];
  Reader param;
  unsigned_long i;
  Iterator __end5;
  Iterator __begin5;
  Range<unsigned_long> *__range5;
  Builder implicitBuilder;
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> implicitDecls;
  Own<capnp::compiler::NodeTranslator::BrandScope> brand;
  Orphan<capnp::schema::Node::SourceInfo> local_348;
  uint64_t local_328;
  uint64_t id;
  CapTableBuilder *pCStack_318;
  void *local_310;
  WirePointer *pWStack_308;
  StructDataBitCount local_300;
  StructPointerCount SStack_2fc;
  undefined2 uStack_2fa;
  int local_2f8;
  undefined4 uStack_2f4;
  SegmentBuilder *pSStack_2f0;
  CapTableBuilder *local_2e8;
  void *pvStack_2e0;
  WirePointer *local_2d8;
  Reader local_2c8;
  SegmentReader *pSStack_290;
  CapTableReader *pCStack_288;
  byte *pbStack_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  StructTranslator local_260;
  Builder local_180;
  Builder local_158;
  undefined1 local_139;
  ArrayPtr<const_char> local_138;
  String local_128;
  ArrayPtr<const_char> local_110;
  undefined1 local_100 [16];
  String typeName;
  ReaderFor<capnp::schema::Node> parent;
  BuilderFor<capnp::schema::Node> builder;
  undefined1 local_78 [8];
  Orphan<capnp::schema::Node::SourceInfo> newSourceInfo;
  Orphan<capnp::schema::Node> newStruct;
  Type *initBrand_local;
  bool isResults_local;
  uint16_t ordinal_local;
  NodeTranslator *this_local;
  StringPtr methodName_local;
  
  methodName_local.content.ptr = (char *)methodName.content.size_;
  params_2 = (NodeTranslator *)methodName.content.ptr;
  this_local = params_2;
  WVar5 = Declaration::ParamList::Reader::which(&paramList);
  if (WVar5 == NAMED_LIST) {
    Orphanage::newOrphan<capnp::schema::Node>
              ((Orphan<capnp::schema::Node> *)&newSourceInfo.builder.location,&this->orphanage);
    Orphanage::newOrphan<capnp::schema::Node::SourceInfo>
              ((Orphan<capnp::schema::Node::SourceInfo> *)local_78,&this->orphanage);
    Orphan<capnp::schema::Node>::get
              ((BuilderFor<capnp::schema::Node> *)&parent._reader.nestingLimit,
               (Orphan<capnp::schema::Node> *)&newSourceInfo.builder.location);
    Orphan<capnp::schema::Node>::getReader
              ((ReaderFor<capnp::schema::Node> *)&typeName.content.disposer,&this->wipNode);
    local_100._0_8_ = "$Params";
    if (isResults) {
      local_100._0_8_ = "$Results";
    }
    kj::str<kj::StringPtr&,char_const*>
              ((String *)(local_100 + 8),(kj *)&this_local,(StringPtr *)local_100,
               (char **)"$Results");
    uVar7 = capnp::schema::Node::Reader::getId((Reader *)&typeName.content.disposer);
    uVar7 = generateMethodParamsId(uVar7,ordinal,isResults);
    capnp::schema::Node::Builder::setId((Builder *)&parent._reader.nestingLimit,uVar7);
    local_138 = (ArrayPtr<const_char>)
                capnp::schema::Node::Reader::getDisplayName((Reader *)&typeName.content.disposer);
    local_139 = 0x2e;
    kj::str<capnp::Text::Reader,char,kj::String&>
              (&local_128,(kj *)&local_138,(Reader *)&local_139,local_100 + 8,(String *)params_2);
    Text::Reader::Reader((Reader *)&local_110,&local_128);
    capnp::schema::Node::Builder::setDisplayName
              ((Builder *)&parent._reader.nestingLimit,(Reader)local_110);
    kj::String::~String(&local_128);
    capnp::schema::Node::Builder::getDisplayName(&local_158,(Builder *)&parent._reader.nestingLimit)
    ;
    sVar8 = Text::Builder::size(&local_158);
    sVar9 = kj::String::size((String *)(local_100 + 8));
    capnp::schema::Node::Builder::setDisplayNamePrefixLength
              ((Builder *)&parent._reader.nestingLimit,(int)sVar8 - (int)sVar9);
    bVar4 = capnp::schema::Node::Reader::getIsGeneric((Reader *)&typeName.content.disposer);
    local_842 = true;
    if (!bVar4) {
      uVar6 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                        (&implicitParams);
      local_842 = uVar6 != 0;
    }
    capnp::schema::Node::Builder::setIsGeneric((Builder *)&parent._reader.nestingLimit,local_842);
    capnp::schema::Node::Builder::setScopeId((Builder *)&parent._reader.nestingLimit,0);
    capnp::schema::Node::Builder::initStruct(&local_180,(Builder *)&parent._reader.nestingLimit);
    uVar7 = capnp::schema::Node::Builder::getId((Builder *)&parent._reader.nestingLimit);
    RVar3 = implicitParams;
    pSStack_290 = implicitParams.reader.segment;
    pCStack_288 = implicitParams.reader.capTable;
    pbStack_280 = implicitParams.reader.ptr;
    uStack_278._0_4_ = implicitParams.reader.elementCount;
    uStack_278._4_4_ = implicitParams.reader.step;
    implicitParams.reader._32_8_ = RVar3.reader._32_8_;
    local_270._0_4_ = implicitParams.reader.structDataSize;
    local_270._4_2_ = implicitParams.reader.structPointerCount;
    local_270._6_1_ = implicitParams.reader.elementSize;
    local_270._7_1_ = implicitParams.reader._39_1_;
    implicitParams.reader._40_8_ = RVar3.reader._40_8_;
    uStack_268._0_4_ = implicitParams.reader.nestingLimit;
    uStack_268._4_4_ = implicitParams.reader._44_4_;
    implicitMethodParams.params.reader.segment = implicitParams.reader.segment;
    implicitMethodParams.scopeId = uVar7;
    implicitMethodParams.params.reader.capTable = implicitParams.reader.capTable;
    implicitMethodParams.params.reader.ptr = implicitParams.reader.ptr;
    implicitMethodParams.params.reader.elementCount = implicitParams.reader.elementCount;
    implicitMethodParams.params.reader.step = implicitParams.reader.step;
    implicitMethodParams.params.reader.structDataSize = implicitParams.reader.structDataSize;
    implicitMethodParams.params.reader.structPointerCount = implicitParams.reader.structPointerCount
    ;
    implicitMethodParams.params.reader.elementSize = implicitParams.reader.elementSize;
    implicitMethodParams.params.reader._39_1_ = implicitParams.reader._39_1_;
    implicitMethodParams.params.reader.nestingLimit = implicitParams.reader.nestingLimit;
    implicitMethodParams.params.reader._44_4_ = implicitParams.reader._44_4_;
    implicitParams = RVar3;
    StructTranslator::StructTranslator(&local_260,this,implicitMethodParams);
    Declaration::ParamList::Reader::getNamedList(&local_2c8,&paramList);
    local_2d8 = builder._builder.pointers;
    local_2e8 = builder._builder.capTable;
    pvStack_2e0 = builder._builder.data;
    local_2f8 = parent._reader.nestingLimit;
    uStack_2f4 = parent._reader._44_4_;
    pSStack_2f0 = builder._builder.segment;
    Orphan<capnp::schema::Node::SourceInfo>::get
              ((BuilderFor<capnp::schema::Node::SourceInfo> *)&id,
               (Orphan<capnp::schema::Node::SourceInfo> *)local_78);
    params.reader.capTable = local_2c8.reader.capTable;
    params.reader.segment = local_2c8.reader.segment;
    params.reader.ptr = local_2c8.reader.ptr;
    params.reader.elementCount = local_2c8.reader.elementCount;
    params.reader.step = local_2c8.reader.step;
    params.reader.structDataSize = local_2c8.reader.structDataSize;
    params.reader.structPointerCount = local_2c8.reader.structPointerCount;
    params.reader.elementSize = local_2c8.reader.elementSize;
    params.reader._39_1_ = local_2c8.reader._39_1_;
    params.reader.nestingLimit = local_2c8.reader.nestingLimit;
    params.reader._44_4_ = local_2c8.reader._44_4_;
    builder_00._builder.capTable = (CapTableBuilder *)pSStack_2f0;
    builder_00._builder.segment = (SegmentBuilder *)_local_2f8;
    builder_00._builder.data = local_2e8;
    builder_00._builder.pointers = (WirePointer *)pvStack_2e0;
    builder_00._builder._32_8_ = local_2d8;
    sourceInfo._builder.capTable = pCStack_318;
    sourceInfo._builder.segment = (SegmentBuilder *)id;
    sourceInfo._builder.data = local_310;
    sourceInfo._builder.pointers = pWStack_308;
    sourceInfo._builder.dataSize = local_300;
    sourceInfo._builder.pointerCount = SStack_2fc;
    sourceInfo._builder._38_2_ = uStack_2fa;
    StructTranslator::translate(&local_260,params,builder_00,sourceInfo);
    StructTranslator::~StructTranslator(&local_260);
    local_328 = capnp::schema::Node::Builder::getId((Builder *)&parent._reader.nestingLimit);
    pOVar10 = kj::mv<capnp::Orphan<capnp::schema::Node>>
                        ((Orphan<capnp::schema::Node> *)&newSourceInfo.builder.location);
    Orphan<capnp::schema::Node>::Orphan((Orphan<capnp::schema::Node> *)&brand.ptr,pOVar10);
    pOVar11 = kj::mv<capnp::Orphan<capnp::schema::Node::SourceInfo>>
                        ((Orphan<capnp::schema::Node::SourceInfo> *)local_78);
    Orphan<capnp::schema::Node::SourceInfo>::Orphan(&local_348,pOVar11);
    kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::
    add<capnp::compiler::NodeTranslator::AuxNode>(&this->paramStructs,(AuxNode *)&brand.ptr);
    AuxNode::~AuxNode((AuxNode *)&brand.ptr);
    pBVar12 = kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator->(&this->localBrand);
    uVar7 = capnp::schema::Node::Builder::getId((Builder *)&parent._reader.nestingLimit);
    List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
              (&implicitParams);
    BrandScope::push((BrandScope *)&implicitDecls.disposer,(uint64_t)pBVar12,(uint)uVar7);
    uVar6 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                      (&implicitParams);
    if (uVar6 != 0) {
      uVar6 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                        (&implicitParams);
      kj::heapArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl>
                ((ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> *)
                 &implicitBuilder.builder.structDataSize,(ulong)uVar6);
      uVar6 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                        (&implicitParams);
      capnp::schema::Node::Builder::initParameters
                ((Builder *)&__range5,(Builder *)&parent._reader.nestingLimit,uVar6);
      RVar16 = kj::
               indices<capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
                         (&implicitParams);
      __begin5.value = RVar16.begin_;
      __end5 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin5);
      i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin5);
      while( true ) {
        bVar4 = kj::Range<unsigned_long>::Iterator::operator!=(&__end5,(Iterator *)&i);
        if (!bVar4) break;
        puVar13 = kj::Range<unsigned_long>::Iterator::operator*(&__end5);
        param._reader._40_8_ = *puVar13;
        List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)local_420,&implicitParams,param._reader.nestingLimit);
        BrandedDecl::implicitMethodParam(&local_4c8,param._reader.nestingLimit);
        kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl>::
        add<capnp::compiler::NodeTranslator::BrandedDecl>
                  ((ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> *)
                   &implicitBuilder.builder.structDataSize,&local_4c8);
        BrandedDecl::~BrandedDecl(&local_4c8);
        List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Builder::operator[]
                  (&local_4f0,(Builder *)&__range5,param._reader.nestingLimit);
        value = (ArrayPtr<const_char>)
                Declaration::BrandParameter::Reader::getName((Reader *)local_420);
        unique0x100021da = value;
        capnp::schema::Node::Parameter::Builder::setName(&local_4f0,(Reader)value);
        kj::Range<unsigned_long>::Iterator::operator++(&__end5);
      }
      pBVar12 = kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator->
                          ((Own<capnp::compiler::NodeTranslator::BrandScope> *)
                           &implicitDecls.disposer);
      kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl>::finish
                (&local_528,
                 (ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> *)
                 &implicitBuilder.builder.structDataSize);
      target.field_1._160_8_ = 0;
      Expression::Reader::Reader((Reader *)&target.field_1.value.source._reader.nestingLimit);
      BrandScope::setParams
                ((BrandScope *)local_510,
                 (Array<capnp::compiler::NodeTranslator::BrandedDecl> *)pBVar12,(Which)&local_528,
                 (Reader)ZEXT848((ulong)target.field_1._160_8_));
      kj::Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>::~Maybe
                ((Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> *)local_510);
      kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::~Array(&local_528);
      kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl>::~ArrayBuilder
                ((ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> *)
                 &implicitBuilder.builder.structDataSize);
    }
    pBVar12 = kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator->
                        ((Own<capnp::compiler::NodeTranslator::BrandScope> *)&implicitDecls.disposer
                        );
    BrandScope::
    compile<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__2&>
              (pBVar12,initBrand);
    methodName_local.content.size_ = local_328;
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::~Own
              ((Own<capnp::compiler::NodeTranslator::BrandScope> *)&implicitDecls.disposer);
    kj::String::~String((String *)(local_100 + 8));
    Orphan<capnp::schema::Node::SourceInfo>::~Orphan
              ((Orphan<capnp::schema::Node::SourceInfo> *)local_78);
    Orphan<capnp::schema::Node>::~Orphan
              ((Orphan<capnp::schema::Node> *)&newSourceInfo.builder.location);
    return methodName_local.content.size_;
  }
  if (WVar5 != TYPE) {
    kj::_::unreachable();
  }
  Declaration::ParamList::Reader::getType((Reader *)local_6e8,&paramList);
  _auStack_720 = (void *)0x0;
  uVar17 = 0;
  source._reader.capTable = (CapTableReader *)local_6e8._8_8_;
  source._reader.segment = (SegmentReader *)local_6e8._0_8_;
  source._reader.data = (void *)local_6e8._16_8_;
  source._reader.pointers = (WirePointer *)local_6e8._24_8_;
  source._reader.dataSize = local_6e8._32_4_;
  source._reader.pointerCount = local_6e8._36_2_;
  source._reader._38_2_ = local_6e8._38_2_;
  source._reader._40_8_ = local_6e8._40_8_;
  auVar2._48_8_ = 0;
  auVar2._0_8_ = implicitParams.reader.segment;
  auVar2._8_8_ = implicitParams.reader.capTable;
  auVar2._16_8_ = implicitParams.reader.ptr;
  auVar2._24_4_ = implicitParams.reader.elementCount;
  auVar2._28_4_ = implicitParams.reader.step;
  auVar2._32_4_ = implicitParams.reader.structDataSize;
  auVar2._36_2_ = implicitParams.reader.structPointerCount;
  auVar2[0x26] = implicitParams.reader.elementSize;
  auVar2[0x27] = implicitParams.reader._39_1_;
  auVar2._40_4_ = implicitParams.reader.nestingLimit;
  auVar2._44_4_ = implicitParams.reader._44_4_;
  compileDeclExpression(&local_6b8,this,source,(ImplicitParams)(auVar2 << 0x40));
  other = kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandedDecl>(&local_6b8);
  kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_608,other);
  kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::~Maybe(&local_6b8);
  pBVar14 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_608);
  if (pBVar14 != (BrandedDecl *)0x0) {
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator->
              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_608);
    BrandedDecl::getKind((BrandedDecl *)local_728);
    other_00 = kj::_::readMaybe<capnp::compiler::Declaration::Which>
                         ((Maybe<capnp::compiler::Declaration::Which> *)local_728);
    kj::_::NullableValue<capnp::compiler::Declaration::Which>::NullableValue
              ((NullableValue<capnp::compiler::Declaration::Which> *)(local_728 + 4),other_00);
    kj::Maybe<capnp::compiler::Declaration::Which>::~Maybe
              ((Maybe<capnp::compiler::Declaration::Which> *)local_728);
    pWVar15 = kj::_::NullableValue::operator_cast_to_Which_((NullableValue *)(local_728 + 4));
    if (pWVar15 == (Which *)0x0) {
      pBVar14 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator->
                          ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_608)
      ;
      pEVar1 = this->errorReporter;
      kj::StringPtr::StringPtr
                ((StringPtr *)&local_7e0,
                 "Cannot use generic parameter as whole input or output of a method. Instead, use a parameter/result list containing a field with this type."
                );
      BrandedDecl::addError(pBVar14,pEVar1,(StringPtr)local_7e0);
      methodName_local.content.size_ = 0;
      local_72c = 1;
    }
    else {
      pWVar15 = kj::_::NullableValue<capnp::compiler::Declaration::Which>::operator*
                          ((NullableValue<capnp::compiler::Declaration::Which> *)(local_728 + 4));
      if (*pWVar15 == STRUCT) {
        pBVar14 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator->
                            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
                             local_608);
        initBrand_00 = kj::
                       fwd<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__2>
                                 (initBrand);
        methodName_local.content.size_ =
             BrandedDecl::
             getIdAndFillBrand<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__2>
                       (pBVar14,initBrand_00);
        local_72c = 1;
      }
      else {
        pEVar1 = this->errorReporter;
        Declaration::ParamList::Reader::getType(&local_760,&paramList);
        Declaration::ParamList::Reader::getType(&local_7d0,&paramList);
        name._reader.capTable = (CapTableReader *)local_7d0._reader.data;
        name._reader.segment = (SegmentReader *)local_7d0._reader.capTable;
        name._reader.data = local_7d0._reader.pointers;
        name._reader.pointers = (WirePointer *)local_7d0._reader._32_8_;
        name._reader.dataSize = local_7d0._reader.nestingLimit;
        name._reader.pointerCount = local_7d0._reader._44_2_;
        name._reader._38_2_ = local_7d0._reader._46_2_;
        name._reader._40_8_ = uVar17;
        expressionString(name);
        kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                  (&local_788,(kj *)0x325a35,(char (*) [2])&local_7a0,
                   (String *)"\' is not a struct type.",(char (*) [24])params_2);
        kj::StringPtr::StringPtr((StringPtr *)&local_770,&local_788);
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader>
                  (pEVar1,&local_760,(StringPtr)local_770);
        kj::String::~String(&local_788);
        kj::String::~String(&local_7a0);
        local_72c = 0;
      }
    }
    kj::_::NullableValue<capnp::compiler::Declaration::Which>::~NullableValue
              ((NullableValue<capnp::compiler::Declaration::Which> *)(local_728 + 4));
    if (local_72c != 0) goto LAB_00249512;
  }
  local_72c = 0;
LAB_00249512:
  kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_608);
  if (local_72c == 0) {
    methodName_local.content.size_ = 0;
  }
  return methodName_local.content.size_;
}

Assistant:

uint64_t NodeTranslator::compileParamList(
    kj::StringPtr methodName, uint16_t ordinal, bool isResults,
    Declaration::ParamList::Reader paramList,
    typename List<Declaration::BrandParameter>::Reader implicitParams,
    InitBrandFunc&& initBrand) {
  switch (paramList.which()) {
    case Declaration::ParamList::NAMED_LIST: {
      auto newStruct = orphanage.newOrphan<schema::Node>();
      auto newSourceInfo = orphanage.newOrphan<schema::Node::SourceInfo>();
      auto builder = newStruct.get();
      auto parent = wipNode.getReader();

      kj::String typeName = kj::str(methodName, isResults ? "$Results" : "$Params");

      builder.setId(generateMethodParamsId(parent.getId(), ordinal, isResults));
      builder.setDisplayName(kj::str(parent.getDisplayName(), '.', typeName));
      builder.setDisplayNamePrefixLength(builder.getDisplayName().size() - typeName.size());
      builder.setIsGeneric(parent.getIsGeneric() || implicitParams.size() > 0);
      builder.setScopeId(0);  // detached struct type

      builder.initStruct();

      // Note that the struct we create here has a brand parameter list mirrioring the method's
      // implicit parameter list. Of course, fields inside the struct using the method's implicit
      // params as types actually need to refer to them as regular params, so we create an
      // ImplicitParams with a scopeId here.
      StructTranslator(*this, ImplicitParams { builder.getId(), implicitParams })
          .translate(paramList.getNamedList(), builder, newSourceInfo.get());
      uint64_t id = builder.getId();
      paramStructs.add(AuxNode { kj::mv(newStruct), kj::mv(newSourceInfo) });

      auto brand = localBrand->push(builder.getId(), implicitParams.size());

      if (implicitParams.size() > 0) {
        auto implicitDecls = kj::heapArrayBuilder<BrandedDecl>(implicitParams.size());
        auto implicitBuilder = builder.initParameters(implicitParams.size());

        for (auto i: kj::indices(implicitParams)) {
          auto param = implicitParams[i];
          implicitDecls.add(BrandedDecl::implicitMethodParam(i));
          implicitBuilder[i].setName(param.getName());
        }

        brand->setParams(implicitDecls.finish(), Declaration::STRUCT, Expression::Reader());
      }

      brand->compile(initBrand);
      return id;
    }
    case Declaration::ParamList::TYPE:
      KJ_IF_MAYBE(target, compileDeclExpression(
          paramList.getType(), ImplicitParams { 0, implicitParams })) {
        KJ_IF_MAYBE(kind, target->getKind()) {
          if (*kind == Declaration::STRUCT) {
            return target->getIdAndFillBrand(kj::fwd<InitBrandFunc>(initBrand));
          } else {
            errorReporter.addErrorOn(
                paramList.getType(),
                kj::str("'", expressionString(paramList.getType()), "' is not a struct type."));
          }
        } else {
          // A variable?
          target->addError(errorReporter,
              "Cannot use generic parameter as whole input or output of a method. Instead, "
              "use a parameter/result list containing a field with this type.");
          return 0;
        }
      }
      return 0;
  }